

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

void ImDrawList_PathLineToMergeDuplicate(ImDrawList *self,ImVec2 pos)

{
  int iVar1;
  int iVar2;
  ImVec2 *__src;
  ImVec2 *__dest;
  int iVar3;
  int iVar4;
  
  iVar1 = (self->_Path).Size;
  if (((long)iVar1 == 0) || ((self->_Path).Data[(long)iVar1 + -1] != pos)) {
    iVar2 = (self->_Path).Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar2 / 2 + iVar2;
      }
      iVar4 = iVar1 + 1;
      if (iVar1 + 1 < iVar3) {
        iVar4 = iVar3;
      }
      if (iVar2 < iVar4) {
        __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
        __src = (self->_Path).Data;
        if (__src != (ImVec2 *)0x0) {
          memcpy(__dest,__src,(long)(self->_Path).Size << 3);
          ImGui::MemFree((self->_Path).Data);
        }
        (self->_Path).Data = __dest;
        (self->_Path).Capacity = iVar4;
      }
    }
    (self->_Path).Data[(self->_Path).Size] = pos;
    (self->_Path).Size = (self->_Path).Size + 1;
  }
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_PathLineToMergeDuplicate (ImDrawList *larg1, ImVec2 const *larg2) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  try {
    ImDrawList_PathLineToMergeDuplicate(arg1,arg2);
    
  } catch (...) {
    
  }
}